

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrGetMarkerNumberML
                   (XrMarkerDetectorML markerDetector,XrMarkerML marker,uint64_t *number)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrMarkerDetectorML_T_*>::getWithInstanceInfo
                    (&g_markerdetectorml_info,markerDetector);
  XVar1 = (*(pVar2.second)->dispatch_table->GetMarkerNumberML)(markerDetector,marker,number);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrGetMarkerNumberML(
    XrMarkerDetectorML markerDetector,
    XrMarkerML marker,
    uint64_t* number) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_markerdetectorml_info.getWithInstanceInfo(markerDetector);
        GenValidUsageXrHandleInfo *gen_markerdetectorml_info = info_with_instance.first;
        (void)gen_markerdetectorml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->GetMarkerNumberML(markerDetector, marker, number);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}